

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::processVlvWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  int local_44;
  int flag;
  int i;
  ulong uStack_38;
  uchar byte [5];
  ulong value;
  int lineNum_local;
  string *word_local;
  ostream *out_local;
  Binasc *this_local;
  
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
    poVar4 = std::operator<<(poVar4,": \'v\' needs to be followed immediately by a decimal digit");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  else {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)word);
    iVar2 = isdigit((int)*pcVar5);
    if (iVar2 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
      poVar4 = std::operator<<(poVar4,": \'v\' needs to be followed immediately by a decimal digit")
      ;
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = 0;
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)word);
      iVar2 = atoi(pcVar5);
      uStack_38 = (ulong)iVar2;
      flag._3_1_ = (byte)(uStack_38 >> 0x1c) & 0x7f;
      i._0_1_ = (byte)(uStack_38 >> 0x15) & 0x7f;
      i._1_1_ = (byte)(uStack_38 >> 0xe) & 0x7f;
      i._2_1_ = (byte)(uStack_38 >> 7) & 0x7f;
      i._3_1_ = (byte)iVar2 & 0x7f;
      bVar1 = false;
      for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
        if (*(char *)((long)&flag + (long)local_44 + 3) != '\0') {
          bVar1 = true;
        }
        if (bVar1) {
          *(byte *)((long)&flag + (long)local_44 + 3) =
               *(byte *)((long)&flag + (long)local_44 + 3) | 0x80;
        }
      }
      for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
        if ((0x7f < *(byte *)((long)&flag + (long)local_44 + 3)) || (local_44 == 4)) {
          std::operator<<(out,*(uchar *)((long)&flag + (long)local_44 + 3));
        }
      }
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Binasc::processVlvWord(std::ostream& out, const std::string& word,
		int lineNum) {
	if (word.size() < 2) {
		std::cerr << "Error on line: " << lineNum
			  << ": 'v' needs to be followed immediately by a decimal digit"
			  << std::endl;
		return 0;
	}
	if (!isdigit(word[1])) {
		std::cerr << "Error on line: " << lineNum
			  << ": 'v' needs to be followed immediately by a decimal digit"
			  << std::endl;
		return 0;
	}
	ulong value = atoi(&word[1]);

	uchar byte[5];
	byte[0] = (value >> 28) & 0x7f;
	byte[1] = (value >> 21) & 0x7f;
	byte[2] = (value >> 14) & 0x7f;
	byte[3] = (value >>  7) & 0x7f;
	byte[4] = (value >>  0) & 0x7f;

	int i;
	int flag = 0;
	for (i=0; i<4; i++) {
		if (byte[i] != 0) {
			flag = 1;
		}
		if (flag) {
			byte[i] |= 0x80;
		}
	}

	for (i=0; i<5; i++) {
		if (byte[i] >= 0x80 || i == 4) {
			out << byte[i];
		}
	}

	return 1;
}